

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O1

void BeginTextureMode(RenderTexture2D target)

{
  GLuint in_stack_00000008;
  uint in_stack_00000010;
  uint in_stack_00000014;
  
  rlDrawRenderBatch(RLGL.currentBatch);
  (*glad_glBindFramebuffer)(0x8d40,in_stack_00000008);
  (*glad_glViewport)(0,0,in_stack_00000010,in_stack_00000014);
  RLGL.State.framebufferWidth = in_stack_00000010;
  RLGL.State.framebufferHeight = in_stack_00000014;
  RLGL.State.currentMatrix = &RLGL.State.projection;
  RLGL.State.currentMatrixMode = 0x1701;
  RLGL.State.projection.m0 = 1.0;
  RLGL.State.projection.m4 = 0.0;
  RLGL.State.projection.m8 = 0.0;
  RLGL.State.projection.m12 = 0.0;
  RLGL.State.projection.m1 = 0.0;
  RLGL.State.projection.m5 = 1.0;
  RLGL.State.projection.m9 = 0.0;
  RLGL.State.projection.m13 = 0.0;
  RLGL.State.projection.m2 = 0.0;
  RLGL.State.projection.m6 = 0.0;
  RLGL.State.projection.m10 = 1.0;
  RLGL.State.projection.m14 = 0.0;
  RLGL.State.projection.m3 = 0.0;
  RLGL.State.projection.m7 = 0.0;
  RLGL.State.projection.m11 = 0.0;
  RLGL.State.projection.m15 = 1.0;
  rlOrtho(0.0,(double)(int)in_stack_00000010,(double)(int)in_stack_00000014,0.0,0.0,1.0);
  RLGL.State.currentMatrix = &RLGL.State.modelview;
  RLGL.State.currentMatrixMode = 0x1700;
  RLGL.State.modelview.m0 = 1.0;
  RLGL.State.modelview.m4 = 0.0;
  RLGL.State.modelview.m8 = 0.0;
  RLGL.State.modelview.m12 = 0.0;
  RLGL.State.modelview.m1 = 0.0;
  RLGL.State.modelview.m5 = 1.0;
  RLGL.State.modelview.m9 = 0.0;
  RLGL.State.modelview.m13 = 0.0;
  RLGL.State.modelview.m2 = 0.0;
  RLGL.State.modelview.m6 = 0.0;
  RLGL.State.modelview.m10 = 1.0;
  RLGL.State.modelview.m14 = 0.0;
  RLGL.State.modelview.m3 = 0.0;
  RLGL.State.modelview.m7 = 0.0;
  RLGL.State.modelview.m11 = 0.0;
  RLGL.State.modelview.m15 = 1.0;
  CORE.Window.currentFbo.width = in_stack_00000010;
  CORE.Window.currentFbo.height = in_stack_00000014;
  CORE.Window.usingFbo = true;
  return;
}

Assistant:

void BeginTextureMode(RenderTexture2D target)
{
    rlDrawRenderBatchActive();      // Update and draw internal render batch

    rlEnableFramebuffer(target.id); // Enable render target

    // Set viewport and RLGL internal framebuffer size
    rlViewport(0, 0, target.texture.width, target.texture.height);
    rlSetFramebufferWidth(target.texture.width);
    rlSetFramebufferHeight(target.texture.height);

    rlMatrixMode(RL_PROJECTION);    // Switch to projection matrix
    rlLoadIdentity();               // Reset current matrix (projection)

    // Set orthographic projection to current framebuffer size
    // NOTE: Configured top-left corner as (0, 0)
    rlOrtho(0, target.texture.width, target.texture.height, 0, 0.0f, 1.0f);

    rlMatrixMode(RL_MODELVIEW);     // Switch back to modelview matrix
    rlLoadIdentity();               // Reset current matrix (modelview)

    //rlScalef(0.0f, -1.0f, 0.0f);  // Flip Y-drawing (?)

    // Setup current width/height for proper aspect ratio
    // calculation when using BeginMode3D()
    CORE.Window.currentFbo.width = target.texture.width;
    CORE.Window.currentFbo.height = target.texture.height;
    CORE.Window.usingFbo = true;
}